

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationarrow.cpp
# Opt level: O2

void __thiscall QtMWidgets::NavigationArrow::mouseReleaseEvent(NavigationArrow *this,QMouseEvent *e)

{
  char cVar1;
  QMouseEvent QVar2;
  QPoint local_30;
  QRect local_28;
  
  if (*(int *)(e + 0x40) == 1) {
    if (((this->d).d)->leftButtonPressed == true) {
      local_28 = QWidget::rect(&this->super_QWidget);
      local_30 = QMouseEvent::pos(e);
      cVar1 = QRect::contains((QPoint *)&local_28,SUB81(&local_30,0));
      if (cVar1 != '\0') {
        clicked(this);
      }
    }
    ((this->d).d)->leftButtonPressed = false;
    QVar2 = (QMouseEvent)0x1;
  }
  else {
    QVar2 = (QMouseEvent)0x0;
  }
  e[0xc] = QVar2;
  return;
}

Assistant:

void
NavigationArrow::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed && rect().contains( e->pos() ) )
			emit clicked();

		d->leftButtonPressed = false;

		e->accept();
	}
	else
		e->ignore();
}